

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

int __thiscall HModel::util_convertWorkingToBaseStat(HModel *this,int *cstat,int *rstat)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  ulong uVar8;
  
  if ((cstat != (int *)0x0) && (0 < this->numCol)) {
    piVar3 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      uVar1 = piVar3[uVar8];
      if (uVar1 == 0) {
        cstat[uVar8] = 1;
      }
      else {
        iVar2 = piVar4[uVar8];
        if (iVar2 == -1) {
          if (1e+200 <= pdVar6[uVar8]) {
LAB_0012f3b9:
            printf("Invalid basis status: col=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n"
                   ,pdVar5[uVar8],pdVar6[uVar8],uVar8 & 0xffffffff,(ulong)uVar1);
            return (int)uVar8 + 1;
          }
          cstat[uVar8] = 2;
        }
        else {
          if (iVar2 == 0) {
            if ((pdVar5[uVar8] != pdVar6[uVar8]) || (NAN(pdVar5[uVar8]) || NAN(pdVar6[uVar8]))) {
              cstat[uVar8] = 3;
              goto LAB_0012f2e6;
            }
          }
          else if ((iVar2 != 1) || (pdVar5[uVar8] <= -1e+200)) goto LAB_0012f3b9;
          cstat[uVar8] = 0;
        }
      }
LAB_0012f2e6:
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)this->numCol);
  }
  if ((rstat != (int *)0x0) && (0 < this->numRow)) {
    piVar3 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      lVar7 = (long)this->numCol + uVar8;
      uVar1 = piVar3[lVar7];
      if (uVar1 == 0) {
        rstat[uVar8] = 1;
      }
      else {
        iVar2 = piVar4[lVar7];
        if (iVar2 == 1) {
          if (1e+200 <= pdVar6[uVar8]) {
LAB_0012f3db:
            printf("Invalid basis status: row=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n"
                   ,pdVar5[uVar8],pdVar6[uVar8],uVar8 & 0xffffffff,(ulong)uVar1);
            return ~(uint)uVar8;
          }
          rstat[uVar8] = 2;
        }
        else {
          if (iVar2 == 0) {
            if ((pdVar5[uVar8] != pdVar6[uVar8]) || (NAN(pdVar5[uVar8]) || NAN(pdVar6[uVar8]))) {
              rstat[uVar8] = 3;
              goto LAB_0012f3a6;
            }
          }
          else if ((iVar2 != -1) || (pdVar5[uVar8] <= -1e+200)) goto LAB_0012f3db;
          rstat[uVar8] = 0;
        }
      }
LAB_0012f3a6:
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)this->numRow);
  }
  return 0;
}

Assistant:

int HModel::util_convertWorkingToBaseStat(int* cstat, int* rstat) {
  if (cstat != NULL)
    {
      for (int col = 0; col < numCol; col++) {
	int var = col;
	if (!nonbasicFlag[var]) {
	  cstat[col] = HSOL_BASESTAT_BASIC;
	  continue;
	}
	else if (nonbasicMove[var] == NONBASIC_MOVE_UP) 
	  {
#ifdef H2DEBUG
	    if (!hsol_isInfinity(-colLower[col])) 
#endif
	      {
		cstat[col] = HSOL_BASESTAT_LOWER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_DN)
	  {
#ifdef H2DEBUG
            if (!hsol_isInfinity(colUpper[col])) 
#endif
	      {
		cstat[col] = HSOL_BASESTAT_UPPER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_ZE)
	  {
            if (colLower[col] == colUpper[col])
	      {
#ifndef H2DEBUG
		if (!hsol_isInfinity(colUpper[col]))
#endif
		  {
		    cstat[col] = HSOL_BASESTAT_LOWER;
		    continue;
		  }
	      }
            else
	      {
#ifndef H2DEBUG
		if (hsol_isInfinity(-colLower[col]) && hsol_isInfinity(colLower[col]))
#endif
		  {
		    cstat[col] = HSOL_BASESTAT_ZERO;
		    continue;
		  }
	      }
	  }
#ifdef JAJH_dev
	printf("Invalid basis status: col=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n",
	       col, nonbasicFlag[var], nonbasicMove[var], colLower[col], colUpper[col]);
#endif
	return col+1;
      }
    }
  if (rstat != NULL)
    {
      for (int row = 0; row < numRow; row++) {
	int var = numCol+row;
	if (!nonbasicFlag[var]) {
	  rstat[row] = HSOL_BASESTAT_BASIC;
	  continue;
	}
	//NB nonbasicMove for rows refers to the solver's view where the bounds are switched and negated
	else if (nonbasicMove[var] == NONBASIC_MOVE_DN)
	  //Free to move only down from -rowLower[row]
	  {
#ifdef H2DEBUG
	    if (!hsol_isInfinity(-rowLower[row])) 
#endif
	      {
		rstat[row] = HSOL_BASESTAT_LOWER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_UP)
	  //Free to move only up from -rowUpper[row]
	  {
#ifdef H2DEBUG
            if (!hsol_isInfinity(rowUpper[row])) 
#endif
	      {
		rstat[row] = HSOL_BASESTAT_UPPER;
		continue;
	      }
	  }
	else if (nonbasicMove[var] == NONBASIC_MOVE_ZE)
	  {
            if (rowLower[row] == rowUpper[row])
	      {
#ifndef H2DEBUG
		if (!hsol_isInfinity(rowUpper[row]))
#endif
		  {
		    rstat[row] = HSOL_BASESTAT_LOWER;
		    continue;
		  }
	      }
            else
	      {
#ifndef H2DEBUG
		if (hsol_isInfinity(-rowLower[row]) && hsol_isInfinity(rowLower[row]))
#endif
		  {
		    rstat[row] = HSOL_BASESTAT_ZERO;
		    continue;
		  }
	      }
	  }
#ifdef JAJH_dev
	printf("Invalid basis status: row=%d, nonbasicFlag=%d, nonbasicMove=%d, lower=%g, upper=%g\n",
	       row, nonbasicFlag[var], nonbasicMove[var], rowLower[row], rowUpper[row]);
#endif
	return -(row+1);
      }
    }
  return 0;
}